

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fStencilTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::StencilCase::executeOps
          (StencilCase *this,Context *context,IVec4 *cell,
          vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
          *ops)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Type TVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  undefined4 uVar12;
  StencilOp *op;
  pointer pSVar13;
  undefined8 uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Vec3 local_54;
  Vec3 local_48;
  undefined4 uStack_3c;
  StencilCase *local_38;
  
  iVar1 = cell->m_data[0];
  iVar6 = (*context->_vptr_Context[2])(context);
  iVar2 = cell->m_data[1];
  iVar7 = (*context->_vptr_Context[3])(context);
  iVar3 = cell->m_data[2];
  iVar8 = (*context->_vptr_Context[2])(context);
  iVar4 = cell->m_data[3];
  iVar9 = (*context->_vptr_Context[3])(context);
  uVar10 = this->m_shaderID;
  local_48.m_data[0] = (float)0;
  local_48.m_data[1] = (float)0;
  local_48.m_data[2] = (float)0;
  uStack_3c = 0x3f800000;
  local_38 = this;
  (*context->_vptr_Context[0x76])(context,(ulong)uVar10);
  uVar10 = (*context->_vptr_Context[0x66])(context,(ulong)uVar10,"u_color");
  (*context->_vptr_Context[0x5f])(context,(ulong)uVar10,1,&local_48);
  pSVar13 = (ops->
            super__Vector_base<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pSVar13 !=
      (ops->
      super__Vector_base<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    fVar16 = (float)iVar1 / (float)iVar6;
    fVar17 = fVar16 + fVar16 + -1.0;
    fVar16 = (float)iVar2 / (float)iVar7;
    fVar18 = fVar16 + fVar16 + -1.0;
    fVar16 = (float)iVar3 / (float)iVar8;
    fVar15 = (float)iVar4 / (float)iVar9;
    do {
      TVar5 = pSVar13->type;
      if (TVar5 == TYPE_CLEAR_STENCIL) {
        (*context->_vptr_Context[0x33])(context,0xc11);
        (*context->_vptr_Context[0x32])
                  (context,(ulong)(uint)cell->m_data[0],(ulong)(uint)cell->m_data[1],
                   (ulong)(uint)cell->m_data[2],(ulong)(uint)cell->m_data[3]);
        (*context->_vptr_Context[0x2c])(context,(ulong)(uint)pSVar13->stencil);
        uVar12 = 0x400;
LAB_00f43378:
        uVar14 = 0xc11;
        lVar11 = 0x168;
LAB_00f4337d:
        (**(code **)((long)context->_vptr_Context + lVar11))(context,uVar12);
        (*context->_vptr_Context[0x34])(context,uVar14);
      }
      else {
        if (TVar5 == TYPE_QUAD) {
          uVar14 = 0xb71;
          (*context->_vptr_Context[0x33])(context,0xb71);
          uVar12 = 0xb90;
          (*context->_vptr_Context[0x33])(context,0xb90);
          (*context->_vptr_Context[0x39])(context,(ulong)pSVar13->depthTest);
          (*context->_vptr_Context[0x35])
                    (context,(ulong)pSVar13->stencilTest,(ulong)(uint)pSVar13->stencil,
                     (ulong)pSVar13->stencilMask);
          (*context->_vptr_Context[0x36])
                    (context,(ulong)pSVar13->sFail,(ulong)pSVar13->dFail,(ulong)pSVar13->dPass);
          local_54.m_data[2] = pSVar13->depth;
          local_54.m_data[0] = fVar16 + fVar16 + fVar17;
          local_54.m_data[1] = fVar15 + fVar15 + fVar18;
          local_48.m_data[0] = fVar17;
          local_48.m_data[1] = fVar18;
          local_48.m_data[2] = local_54.m_data[2];
          sglr::drawQuad(context,local_38->m_shaderID,&local_48,&local_54);
          lVar11 = 0x1a0;
          goto LAB_00f4337d;
        }
        if (TVar5 == TYPE_CLEAR_DEPTH) {
          (*context->_vptr_Context[0x33])(context,0xc11);
          (*context->_vptr_Context[0x32])
                    (context,(ulong)(uint)cell->m_data[0],(ulong)(uint)cell->m_data[1],
                     (ulong)(uint)cell->m_data[2],(ulong)(uint)cell->m_data[3]);
          (*context->_vptr_Context[0x2b])(pSVar13->depth,context);
          uVar12 = 0x100;
          goto LAB_00f43378;
        }
      }
      pSVar13 = pSVar13 + 1;
    } while (pSVar13 !=
             (ops->
             super__Vector_base<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void StencilCase::executeOps (sglr::Context& context, const IVec4& cell, const vector<StencilOp>& ops)
{
	// For quadOps
	float x0 = 2.0f*((float)cell.x() / (float)context.getWidth())-1.0f;
	float y0 = 2.0f*((float)cell.y() / (float)context.getHeight())-1.0f;
	float x1 = x0 + 2.0f*((float)cell.z() / (float)context.getWidth());
	float y1 = y0 + 2.0f*((float)cell.w() / (float)context.getHeight());

	m_shader.setColor(context, m_shaderID, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	for (vector<StencilOp>::const_iterator i = ops.begin(); i != ops.end(); i++)
	{
		const StencilOp& op = *i;

		switch (op.type)
		{
			case StencilOp::TYPE_CLEAR_DEPTH:
				context.enable(GL_SCISSOR_TEST);
				context.scissor(cell.x(), cell.y(), cell.z(), cell.w());
				context.clearDepthf(op.depth);
				context.clear(GL_DEPTH_BUFFER_BIT);
				context.disable(GL_SCISSOR_TEST);
				break;

			case StencilOp::TYPE_CLEAR_STENCIL:
				context.enable(GL_SCISSOR_TEST);
				context.scissor(cell.x(), cell.y(), cell.z(), cell.w());
				context.clearStencil(op.stencil);
				context.clear(GL_STENCIL_BUFFER_BIT);
				context.disable(GL_SCISSOR_TEST);
				break;

			case StencilOp::TYPE_QUAD:
				context.enable(GL_DEPTH_TEST);
				context.enable(GL_STENCIL_TEST);
				context.depthFunc(op.depthTest);
				context.stencilFunc(op.stencilTest, op.stencil, op.stencilMask);
				context.stencilOp(op.sFail, op.dFail, op.dPass);
				sglr::drawQuad(context, m_shaderID, Vec3(x0, y0, op.depth), Vec3(x1, y1, op.depth));
				context.disable(GL_STENCIL_TEST);
				context.disable(GL_DEPTH_TEST);
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}